

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)

{
  UInt64 UVar1;
  Byte local_11;
  Byte temp;
  CPpmd7z_RangeEnc *p_local;
  
  if (((uint)p->Low < 0xff000000) || ((int)(p->Low >> 0x20) != 0)) {
    local_11 = p->Cache;
    do {
      (*p->Stream->Write)(p->Stream,local_11 + (char)(p->Low >> 0x20));
      local_11 = 0xff;
      UVar1 = p->CacheSize - 1;
      p->CacheSize = UVar1;
    } while (UVar1 != 0);
    p->Cache = (Byte)(p->Low >> 0x18);
  }
  p->CacheSize = p->CacheSize + 1;
  p->Low = (ulong)(uint)((int)p->Low << 8);
  return;
}

Assistant:

static void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)
{
  if ((UInt32)p->Low < (UInt32)0xFF000000 || (unsigned)(p->Low >> 32) != 0)
  {
    Byte temp = p->Cache;
    do
    {
      p->Stream->Write(p->Stream, (Byte)(temp + (Byte)(p->Low >> 32)));
      temp = 0xFF;
    }
    while(--p->CacheSize != 0);
    p->Cache = (Byte)((UInt32)p->Low >> 24);
  }
  p->CacheSize++;
  p->Low = ((UInt32)p->Low << 8) & 0xFFFFFFFF;
}